

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

p_ply ply_create_to_file(FILE *fp,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata
                        ,void *pdata)

{
  p_ply ptVar1;
  t_ply_odriver *ptVar2;
  t_ply_odriver *ptVar3;
  
  ptVar1 = (p_ply)calloc(1,0x20f0);
  if (ptVar1 == (p_ply)0x0) {
    ptVar1 = (p_ply)0x0;
  }
  else {
    ptVar1->buffer[0] = '\0';
    ptVar1->element = (p_ply_element)0x0;
    ptVar1->nelements = 0;
    ptVar1->comment = (char *)0x0;
    ptVar1->ncomments = 0;
    ptVar1->obj_info = (char *)0x0;
    ptVar1->nobj_infos = 0;
    ptVar1->buffer_first = 0;
    ptVar1->buffer_token = 0;
    ptVar1->buffer_last = 0;
    ptVar1->idriver = (p_ply_idriver)0x0;
    ptVar1->odriver = (p_ply_odriver)0x0;
    ptVar1->welement = 0;
    ptVar1->wproperty = 0;
    ptVar1->winstance_index = 0;
    ptVar1->wvalue_index = 0;
    ptVar1->wlength = 0;
  }
  if (ptVar1 == (p_ply)0x0) {
    ptVar1 = (p_ply)0x0;
    (*error_cb)((p_ply)0x0,"Out of memory");
  }
  else {
    ptVar1->idata = idata;
    ptVar1->pdata = pdata;
    ptVar1->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) {
      storage_mode = PLY_LITTLE_ENDIAN;
    }
    ptVar3 = &ply_odriver_binary_reverse;
    if (storage_mode == PLY_LITTLE_ENDIAN) {
      ptVar3 = &ply_odriver_binary;
    }
    ptVar2 = &ply_odriver_ascii;
    if (storage_mode != PLY_ASCII) {
      ptVar2 = ptVar3;
    }
    ptVar1->odriver = ptVar2;
    ptVar1->storage_mode = storage_mode;
    ptVar1->fp = fp;
    ptVar1->own_fp = 0;
    ptVar1->error_cb = error_cb;
  }
  return ptVar1;
}

Assistant:

p_ply ply_create_to_file(FILE *fp, e_ply_storage_mode storage_mode,
        p_ply_error_cb error_cb, long idata, void *pdata) {
    p_ply ply;
    assert(fp && storage_mode <= PLY_DEFAULT);
    if (!ply_type_check()) {
        error_cb(NULL, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII) ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->own_fp = 0;
    ply->error_cb = error_cb;
    return ply;
}